

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtMiniSDF.cpp
# Opt level: O3

bool __thiscall cbtMiniSDF::load(cbtMiniSDF *this,char *data,int size)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  cbtAlignedObjectArray<double> *pcVar4;
  double *ptr;
  cbtAlignedObjectArray<cbtCell32> *pcVar5;
  cbtAlignedObjectArray<unsigned_int> *pcVar6;
  uint *ptr_00;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  uint uVar21;
  ulong uVar22;
  double *pdVar23;
  long lVar24;
  cbtCell32 *pcVar25;
  ulong uVar26;
  uint *puVar27;
  uint uVar28;
  long lVar29;
  uint uVar30;
  char *pcVar31;
  int iVar32;
  char *pcVar33;
  ulong uVar34;
  ulong uVar35;
  int iVar36;
  ulong in_R9;
  cbtAlignedObjectArray<double> *unaff_R15;
  unsigned_long_long n_cell_maps1;
  undefined1 uVar37;
  cbtScalar cVar38;
  undefined1 in_ZMM0 [64];
  undefined1 auVar39 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar40 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar41 [16];
  undefined1 in_ZMM3 [64];
  undefined1 in_register_00001304 [12];
  cbtAlignedObjectArray<cbtCell32> local_50;
  
  auVar40 = in_ZMM2._0_16_;
  auVar39 = in_ZMM1._0_16_;
  auVar41 = in_ZMM3._0_16_;
  uVar28 = 0;
  if (size < 0x30) {
    uVar22 = 0;
  }
  else {
    in_ZMM0 = ZEXT1664(CONCAT124(in_ZMM0._4_12_,(float)*(double *)(data + 0x10)));
    auVar40 = vcvtpd2ps_avx(*(undefined1 (*) [16])data);
    auVar41 = vcvtpd2ps_avx(*(undefined1 (*) [16])(data + 0x18));
    uVar22 = 0x30;
    auVar39._0_4_ = (float)*(double *)(data + 0x28);
    auVar39._4_12_ = in_ZMM1._4_12_;
  }
  uVar30 = (uint)uVar22 | 0xc;
  uVar3 = vmovlps_avx(auVar40);
  *(undefined8 *)(this->m_domain).m_min.m_floats = uVar3;
  (this->m_domain).m_min.m_floats[2] = in_ZMM0._0_4_;
  (this->m_domain).m_min.m_floats[3] = 0.0;
  uVar3 = vmovlps_avx(auVar41);
  *(undefined8 *)(this->m_domain).m_max.m_floats = uVar3;
  (this->m_domain).m_max.m_floats[2] = auVar39._0_4_;
  (this->m_domain).m_max.m_floats[3] = 0.0;
  if ((int)uVar30 <= size) {
    in_ZMM0 = ZEXT864(*(ulong *)(data + uVar22));
    uVar28 = *(uint *)(data + uVar22 + 8);
    uVar22 = (ulong)uVar30;
  }
  iVar32 = (int)uVar22;
  uVar30 = iVar32 + 0x18;
  uVar3 = vmovlps_avx(in_ZMM0._0_16_);
  *(undefined8 *)this->m_resolution = uVar3;
  this->m_resolution[2] = uVar28;
  if ((int)uVar30 <= size) {
    auVar39 = vcvtpd2ps_avx(*(undefined1 (*) [16])(data + uVar22));
    in_ZMM0 = ZEXT1664(CONCAT124(in_register_00001304,(float)*(double *)(data + uVar22 + 0x10)));
    uVar22 = (ulong)uVar30;
    uVar30 = iVar32 + 0x30;
  }
  uVar3 = vmovlps_avx(auVar39);
  *(undefined8 *)(this->m_cell_size).m_floats = uVar3;
  cVar38 = in_ZMM0._0_4_;
  (this->m_cell_size).m_floats[2] = cVar38;
  if ((int)uVar30 <= size) {
    auVar39 = vcvtpd2ps_avx(*(undefined1 (*) [16])(data + uVar22));
    cVar38 = (cbtScalar)*(double *)(data + uVar22 + 0x10);
    uVar22 = (ulong)uVar30;
  }
  uVar28 = (uint)uVar22;
  uVar30 = uVar28 + 8;
  uVar3 = vmovlps_avx(auVar39);
  *(undefined8 *)(this->m_inv_cell_size).m_floats = uVar3;
  (this->m_inv_cell_size).m_floats[2] = cVar38;
  pcVar31 = data;
  if ((int)uVar30 <= size) {
    pcVar31 = data + uVar22;
    uVar21 = uVar28 + 0x10;
    uVar22 = (ulong)uVar21;
    pcVar31 = *(char **)pcVar31;
    uVar28 = uVar30;
    uVar30 = uVar21;
  }
  this->m_n_cells = (size_t)pcVar31;
  if (size < (int)uVar30) {
    uVar35 = (ulong)uVar28;
    uVar34 = (ulong)uVar30;
  }
  else {
    uVar22 = *(ulong *)(data + uVar28);
    uVar34 = (ulong)(uVar30 + 8);
    uVar35 = (ulong)uVar30;
  }
  this->m_n_fields = uVar22;
  if ((size < (int)uVar34) ||
     (pcVar31 = *(char **)(data + uVar35), uVar35 = uVar34, pcVar31 < (char *)0x40000001)) {
    local_50.m_ownsMemory = true;
    local_50.m_data = (cbtCell32 *)0x0;
    local_50.m_size = 0;
    local_50.m_capacity = 0;
    cbtAlignedObjectArray<cbtAlignedObjectArray<double>_>::resize
              (&this->m_nodes,(int)pcVar31,(cbtAlignedObjectArray<double> *)&local_50);
    cbtAlignedObjectArray<double>::~cbtAlignedObjectArray
              ((cbtAlignedObjectArray<double> *)&local_50);
    if (pcVar31 != (char *)0x0) {
      pcVar33 = (char *)0x0;
      do {
        uVar28 = (uint)uVar35;
        if ((int)(uVar28 + 8) <= size) {
          in_R9 = *(ulong *)(data + (int)uVar28);
          uVar28 = uVar28 + 8;
        }
        pcVar4 = (this->m_nodes).m_data;
        iVar32 = (int)pcVar33;
        uVar30 = pcVar4[iVar32].m_size;
        unaff_R15 = pcVar4 + iVar32;
        iVar36 = (int)in_R9;
        if ((int)uVar30 < iVar36) {
          if (unaff_R15->m_capacity < iVar36) {
            if (iVar36 == 0) {
              pdVar23 = (double *)0x0;
              uVar21 = uVar30;
            }
            else {
              pdVar23 = (double *)cbtAlignedAllocInternal((long)iVar36 << 3,0x10);
              uVar21 = unaff_R15->m_size;
            }
            ptr = unaff_R15->m_data;
            if ((int)uVar21 < 1) {
              if (ptr != (double *)0x0) goto LAB_008d9eeb;
            }
            else {
              uVar22 = 0;
              do {
                pdVar23[uVar22] = ptr[uVar22];
                uVar22 = uVar22 + 1;
              } while (uVar21 != uVar22);
LAB_008d9eeb:
              if (unaff_R15->m_ownsMemory == true) {
                cbtAlignedFreeInternal(ptr);
              }
            }
            unaff_R15->m_ownsMemory = true;
            unaff_R15->m_data = pdVar23;
            unaff_R15->m_capacity = iVar36;
          }
          else {
            pdVar23 = unaff_R15->m_data;
          }
          memset(pdVar23 + (int)uVar30,0,(long)iVar36 * 8 + (long)(int)uVar30 * -8);
        }
        unaff_R15->m_size = iVar36;
        if (0 < iVar36) {
          uVar22 = in_R9 & 0xffffffff;
          lVar24 = 0;
          do {
            if ((int)(uVar28 + 8) <= size) {
              unaff_R15->m_data[lVar24] = *(double *)(data + (int)uVar28);
              uVar22 = (ulong)(uint)unaff_R15->m_size;
              uVar28 = uVar28 + 8;
            }
            lVar24 = lVar24 + 1;
          } while (lVar24 < (int)uVar22);
        }
        uVar35 = (ulong)uVar28;
        pcVar33 = (char *)(ulong)(iVar32 + 1);
      } while (pcVar33 < pcVar31);
    }
    uVar28 = (uint)uVar35;
    if ((int)(uVar28 + 8) <= size) {
      uVar35 = *(ulong *)(data + (int)uVar28);
      uVar28 = uVar28 + 8;
    }
    local_50.m_ownsMemory = true;
    local_50.m_data = (cbtCell32 *)0x0;
    local_50.m_size = 0;
    local_50.m_capacity = 0;
    uVar22 = uVar35 & 0xffffffff;
    cbtAlignedObjectArray<cbtAlignedObjectArray<cbtCell32>_>::resize
              (&this->m_cells,(int)uVar35,&local_50);
    cbtAlignedObjectArray<cbtCell32>::~cbtAlignedObjectArray(&local_50);
    if (uVar35 != 0) {
      uVar34 = 0;
      do {
        if ((int)(uVar28 + 8) <= size) {
          in_R9 = *(ulong *)(data + (int)uVar28);
          uVar28 = uVar28 + 8;
        }
        unaff_R15 = (cbtAlignedObjectArray<double> *)(ulong)uVar28;
        pcVar5 = (this->m_cells).m_data;
        uVar30 = pcVar5[uVar34].m_size;
        iVar32 = (int)in_R9;
        if ((int)uVar30 < iVar32) {
          if (pcVar5[uVar34].m_capacity < iVar32) {
            if (iVar32 == 0) {
              pcVar25 = (cbtCell32 *)0x0;
              uVar21 = uVar30;
            }
            else {
              uVar22 = 0x10;
              pcVar25 = (cbtCell32 *)cbtAlignedAllocInternal((long)iVar32 << 7,0x10);
              uVar21 = pcVar5[uVar34].m_size;
            }
            if (0 < (int)uVar21) {
              lVar24 = 0;
              do {
                puVar1 = (undefined8 *)((long)(pcVar5[uVar34].m_data)->m_cells + lVar24);
                uVar3 = *puVar1;
                uVar7 = puVar1[1];
                uVar8 = puVar1[2];
                uVar9 = puVar1[3];
                uVar10 = puVar1[4];
                uVar11 = puVar1[5];
                uVar12 = puVar1[6];
                uVar13 = puVar1[7];
                puVar1 = (undefined8 *)((long)(pcVar5[uVar34].m_data)->m_cells + lVar24 + 0x40);
                uVar14 = puVar1[1];
                uVar15 = puVar1[2];
                uVar16 = puVar1[3];
                uVar17 = puVar1[4];
                uVar18 = puVar1[5];
                uVar19 = puVar1[6];
                uVar20 = puVar1[7];
                puVar2 = (undefined8 *)((long)pcVar25->m_cells + lVar24 + 0x40);
                *puVar2 = *puVar1;
                puVar2[1] = uVar14;
                puVar2[2] = uVar15;
                puVar2[3] = uVar16;
                puVar2[4] = uVar17;
                puVar2[5] = uVar18;
                puVar2[6] = uVar19;
                puVar2[7] = uVar20;
                puVar1 = (undefined8 *)((long)pcVar25->m_cells + lVar24);
                *puVar1 = uVar3;
                puVar1[1] = uVar7;
                puVar1[2] = uVar8;
                puVar1[3] = uVar9;
                puVar1[4] = uVar10;
                puVar1[5] = uVar11;
                puVar1[6] = uVar12;
                puVar1[7] = uVar13;
                lVar24 = lVar24 + 0x80;
              } while ((ulong)uVar21 << 7 != lVar24);
            }
            if ((pcVar5[uVar34].m_data != (cbtCell32 *)0x0) && (pcVar5[uVar34].m_ownsMemory == true)
               ) {
              cbtAlignedFreeInternal(pcVar5[uVar34].m_data);
            }
            pcVar5[uVar34].m_ownsMemory = true;
            pcVar5[uVar34].m_data = pcVar25;
            pcVar5[uVar34].m_capacity = iVar32;
          }
          lVar29 = (long)iVar32 - (long)(int)uVar30;
          lVar24 = (long)(int)uVar30 << 7;
          do {
            pcVar25 = pcVar5[uVar34].m_data;
            puVar1 = (undefined8 *)((long)pcVar25->m_cells + lVar24 + 0x40);
            *puVar1 = 0;
            puVar1[1] = 0;
            puVar1[2] = 0;
            puVar1[3] = 0;
            puVar1[4] = 0;
            puVar1[5] = 0;
            puVar1[6] = 0;
            puVar1[7] = 0;
            puVar1 = (undefined8 *)((long)pcVar25->m_cells + lVar24);
            *puVar1 = 0;
            puVar1[1] = 0;
            puVar1[2] = 0;
            puVar1[3] = 0;
            puVar1[4] = 0;
            puVar1[5] = 0;
            puVar1[6] = 0;
            puVar1[7] = 0;
            lVar24 = lVar24 + 0x80;
            lVar29 = lVar29 + -1;
          } while (lVar29 != 0);
        }
        pcVar5[uVar34].m_size = iVar32;
        if (in_R9 != 0) {
          lVar24 = 0;
          uVar26 = in_R9;
          do {
            uVar28 = (uint)unaff_R15;
            if ((int)(uVar28 + 0x80) <= size) {
              uVar22 = (ulong)(int)uVar28;
              pcVar25 = pcVar5[uVar34].m_data;
              pcVar31 = data + uVar22;
              uVar3 = *(undefined8 *)pcVar31;
              uVar7 = *(undefined8 *)(pcVar31 + 8);
              uVar8 = *(undefined8 *)(pcVar31 + 0x10);
              uVar9 = *(undefined8 *)(pcVar31 + 0x18);
              uVar10 = *(undefined8 *)(pcVar31 + 0x20);
              uVar11 = *(undefined8 *)(pcVar31 + 0x28);
              uVar12 = *(undefined8 *)(pcVar31 + 0x30);
              uVar13 = *(undefined8 *)(pcVar31 + 0x38);
              pcVar31 = data + uVar22 + 0x40;
              uVar14 = *(undefined8 *)(pcVar31 + 8);
              uVar15 = *(undefined8 *)(pcVar31 + 0x10);
              uVar16 = *(undefined8 *)(pcVar31 + 0x18);
              uVar17 = *(undefined8 *)(pcVar31 + 0x20);
              uVar18 = *(undefined8 *)(pcVar31 + 0x28);
              uVar19 = *(undefined8 *)(pcVar31 + 0x30);
              uVar20 = *(undefined8 *)(pcVar31 + 0x38);
              puVar1 = (undefined8 *)((long)pcVar25->m_cells + lVar24 + 0x40);
              *puVar1 = *(undefined8 *)pcVar31;
              puVar1[1] = uVar14;
              puVar1[2] = uVar15;
              puVar1[3] = uVar16;
              puVar1[4] = uVar17;
              puVar1[5] = uVar18;
              puVar1[6] = uVar19;
              puVar1[7] = uVar20;
              puVar1 = (undefined8 *)((long)pcVar25->m_cells + lVar24);
              *puVar1 = uVar3;
              puVar1[1] = uVar7;
              puVar1[2] = uVar8;
              puVar1[3] = uVar9;
              puVar1[4] = uVar10;
              puVar1[5] = uVar11;
              puVar1[6] = uVar12;
              puVar1[7] = uVar13;
              uVar28 = uVar28 + 0x80;
            }
            lVar24 = lVar24 + 0x80;
            uVar26 = uVar26 - 1;
            unaff_R15 = (cbtAlignedObjectArray<double> *)(ulong)uVar28;
          } while (uVar26 != 0);
        }
        uVar34 = uVar34 + 1;
      } while (uVar34 != uVar35);
    }
    if ((int)(uVar28 + 8) <= size) {
      uVar22 = *(ulong *)(data + (int)uVar28);
      uVar28 = uVar28 + 8;
    }
    local_50.m_ownsMemory = true;
    local_50.m_data = (cbtCell32 *)0x0;
    local_50.m_size = 0;
    local_50.m_capacity = 0;
    cbtAlignedObjectArray<cbtAlignedObjectArray<unsigned_int>_>::resize
              (&this->m_cell_map,(int)uVar22,(cbtAlignedObjectArray<unsigned_int> *)&local_50);
    cbtAlignedObjectArray<unsigned_int>::~cbtAlignedObjectArray
              ((cbtAlignedObjectArray<unsigned_int> *)&local_50);
    if (uVar22 != 0) {
      uVar35 = 0;
      do {
        if ((int)(uVar28 + 8) <= size) {
          unaff_R15 = *(cbtAlignedObjectArray<double> **)(data + (int)uVar28);
          uVar28 = uVar28 + 8;
        }
        pcVar6 = (this->m_cell_map).m_data;
        uVar30 = pcVar6[uVar35].m_size;
        iVar32 = (int)unaff_R15;
        if ((int)uVar30 < iVar32) {
          if (pcVar6[uVar35].m_capacity < iVar32) {
            if (iVar32 == 0) {
              puVar27 = (uint *)0x0;
              uVar21 = uVar30;
            }
            else {
              puVar27 = (uint *)cbtAlignedAllocInternal((long)iVar32 << 2,0x10);
              uVar21 = pcVar6[uVar35].m_size;
            }
            ptr_00 = pcVar6[uVar35].m_data;
            if ((int)uVar21 < 1) {
              if (ptr_00 != (uint *)0x0) goto LAB_008da24c;
            }
            else {
              uVar34 = 0;
              do {
                puVar27[uVar34] = ptr_00[uVar34];
                uVar34 = uVar34 + 1;
              } while (uVar21 != uVar34);
LAB_008da24c:
              if (pcVar6[uVar35].m_ownsMemory == true) {
                cbtAlignedFreeInternal(ptr_00);
              }
            }
            pcVar6[uVar35].m_ownsMemory = true;
            pcVar6[uVar35].m_data = puVar27;
            pcVar6[uVar35].m_capacity = iVar32;
          }
          else {
            puVar27 = pcVar6[uVar35].m_data;
          }
          memset(puVar27 + (int)uVar30,0,(long)iVar32 * 4 + (long)(int)uVar30 * -4);
        }
        pcVar6[uVar35].m_size = iVar32;
        if (unaff_R15 != (cbtAlignedObjectArray<double> *)0x0) {
          lVar24 = 0;
          do {
            if ((int)(uVar28 + 4) <= size) {
              pcVar6[uVar35].m_data[lVar24] = *(uint *)(data + (int)uVar28);
              uVar28 = uVar28 + 4;
            }
            lVar24 = lVar24 + 1;
          } while (unaff_R15 != (cbtAlignedObjectArray<double> *)lVar24);
        }
        uVar35 = uVar35 + 1;
      } while (uVar35 != uVar22);
    }
    uVar37 = uVar28 == size;
    this->m_isValid = (bool)uVar37;
  }
  else {
    uVar37 = this->m_isValid;
  }
  return (bool)uVar37;
}

Assistant:

bool cbtMiniSDF::load(const char* data, int size)
{
	int fileSize = -1;

	cbtSdfDataStream ds(data, size);
	{
		double buf[6];
		ds.read(buf);
		m_domain.m_min[0] = buf[0];
		m_domain.m_min[1] = buf[1];
		m_domain.m_min[2] = buf[2];
		m_domain.m_min[3] = 0;
		m_domain.m_max[0] = buf[3];
		m_domain.m_max[1] = buf[4];
		m_domain.m_max[2] = buf[5];
		m_domain.m_max[3] = 0;
	}
	{
		unsigned int buf2[3];
		ds.read(buf2);
		m_resolution[0] = buf2[0];
		m_resolution[1] = buf2[1];
		m_resolution[2] = buf2[2];
	}
	{
		double buf[3];
		ds.read(buf);
		m_cell_size[0] = buf[0];
		m_cell_size[1] = buf[1];
		m_cell_size[2] = buf[2];
	}
	{
		double buf[3];
		ds.read(buf);
		m_inv_cell_size[0] = buf[0];
		m_inv_cell_size[1] = buf[1];
		m_inv_cell_size[2] = buf[2];
	}
	{
		unsigned long long int cells;
		ds.read(cells);
		m_n_cells = cells;
	}
	{
		unsigned long long int fields;
		ds.read(fields);
		m_n_fields = fields;
	}

	unsigned long long int nodes0;
	std::size_t n_nodes0;
	ds.read(nodes0);
	n_nodes0 = nodes0;
	if (n_nodes0 > 1024 * 1024 * 1024)
	{
		return m_isValid;
	}
	m_nodes.resize(n_nodes0);
	for (unsigned int i = 0; i < n_nodes0; i++)
	{
		unsigned long long int n_nodes1;
		ds.read(n_nodes1);
		cbtAlignedObjectArray<double>& nodes = m_nodes[i];
		nodes.resize(n_nodes1);
		for (int j = 0; j < nodes.size(); j++)
		{
			double& node = nodes[j];
			ds.read(node);
		}
	}

	unsigned long long int n_cells0;
	ds.read(n_cells0);
	m_cells.resize(n_cells0);
	for (int i = 0; i < n_cells0; i++)
	{
		unsigned long long int n_cells1;
		cbtAlignedObjectArray<cbtCell32>& cells = m_cells[i];
		ds.read(n_cells1);
		cells.resize(n_cells1);
		for (int j = 0; j < n_cells1; j++)
		{
			cbtCell32& cell = cells[j];
			ds.read(cell);
		}
	}

	{
		unsigned long long int n_cell_maps0;
		ds.read(n_cell_maps0);

		m_cell_map.resize(n_cell_maps0);
		for (int i = 0; i < n_cell_maps0; i++)
		{
			unsigned long long int n_cell_maps1;
			cbtAlignedObjectArray<unsigned int>& cell_maps = m_cell_map[i];
			ds.read(n_cell_maps1);
			cell_maps.resize(n_cell_maps1);
			for (int j = 0; j < n_cell_maps1; j++)
			{
				unsigned int& cell_map = cell_maps[j];
				ds.read(cell_map);
			}
		}
	}

	m_isValid = (ds.m_currentOffset == ds.m_size);
	return m_isValid;
}